

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandSat(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Abc_Ntk_t *pNtk;
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int *__ptr;
  char *pcVar5;
  long lVar6;
  long lVar7;
  timespec ts;
  uint local_58;
  uint local_54;
  timespec local_48;
  Abc_Ntk_t *local_38;
  
  local_38 = Abc_FrameReadNtk(pAbc);
  local_54 = 0;
  Extra_UtilGetoptReset();
  local_58 = 0;
  uVar2 = 0;
LAB_0026e74e:
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"CIvh");
    pNtk = local_38;
    iVar4 = globalUtilOptind;
    if (iVar1 == 0x49) {
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-I\" should be followed by an integer.\n";
LAB_0026e801:
        Abc_Print(-1,pcVar5);
        goto LAB_0026e80d;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      uVar3 = uVar2;
    }
    else {
      if (iVar1 == -1) {
        if (local_38 != (Abc_Ntk_t *)0x0) {
          if (0 < local_38->nObjCounts[8]) {
            Abc_Print(-1,"Currently can only solve the miter for combinational circuits.\n");
            return 0;
          }
          iVar4 = clock_gettime(3,&local_48);
          if (iVar4 < 0) {
            lVar6 = 1;
          }
          else {
            lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
            lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_48.tv_sec * -1000000;
          }
          if (pNtk->ntkType == ABC_NTK_LOGIC) {
            Abc_NtkToBdd(pNtk);
          }
          else if (pNtk->ntkType != ABC_NTK_STRASH) {
            __assert_fail("Abc_NtkIsLogic(pNtk)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abc.c"
                          ,0x625e,"int Abc_CommandSat(Abc_Frame_t *, int, char **)");
          }
          iVar4 = Abc_NtkMiterSat(pNtk,(ulong)local_58,(ulong)uVar2,local_54,(ABC_INT64_T *)0x0,
                                  (ABC_INT64_T *)0x0);
          if (iVar4 == 0) {
            if (pNtk->vPos->nSize == 1) {
              __ptr = Abc_NtkVerifySimulatePattern(pNtk,pNtk->pModel);
              if (*__ptr != 1) {
                Abc_Print(1,"ERROR in Abc_NtkMiterSat(): Generated counter example is invalid.\n");
              }
              free(__ptr);
            }
            pAbc->Status = 0;
            pcVar5 = "SATISFIABLE    ";
          }
          else {
            pAbc->Status = iVar4;
            pcVar5 = "UNSATISFIABLE  ";
            if (iVar4 == -1) {
              pcVar5 = "UNDECIDED      ";
            }
          }
          Abc_Print(1,pcVar5);
          iVar4 = clock_gettime(3,&local_48);
          if (iVar4 < 0) {
            lVar7 = -1;
          }
          else {
            lVar7 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
          }
          Abc_Print(1,"%s =","Time");
          Abc_Print(1,"%9.2f sec\n",(double)(lVar7 + lVar6) / 1000000.0);
          return 0;
        }
        pcVar5 = "Empty network.\n";
        iVar4 = -1;
        goto LAB_0026e8ba;
      }
      if (iVar1 == 0x76) {
        local_54 = local_54 ^ 1;
        goto LAB_0026e74e;
      }
      if (iVar1 != 0x43) goto LAB_0026e80d;
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-C\" should be followed by an integer.\n";
        goto LAB_0026e801;
      }
      local_58 = atoi(argv[globalUtilOptind]);
      uVar3 = local_58;
    }
    globalUtilOptind = iVar4 + 1;
    if ((int)uVar3 < 0) {
LAB_0026e80d:
      Abc_Print(-2,"usage: sat [-C num] [-I num] [-vh]\n");
      Abc_Print(-2,"\t         solves the combinational miter using SAT solver MiniSat-1.14\n");
      Abc_Print(-2,"\t         derives CNF from the current network and leave it unchanged\n");
      Abc_Print(-2,"\t         (there is also a newer SAT solving command \"dsat\")\n");
      Abc_Print(-2,"\t-C num : limit on the number of conflicts [default = %d]\n",(ulong)local_58);
      Abc_Print(-2,"\t-I num : limit on the number of inspections [default = %d]\n",(ulong)uVar2);
      pcVar5 = "yes";
      if (local_54 == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-v     : prints verbose information [default = %s]\n",pcVar5);
      pcVar5 = "\t-h     : print the command usage\n";
      iVar4 = -2;
LAB_0026e8ba:
      Abc_Print(iVar4,pcVar5);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandSat( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    int RetValue;
    int fVerbose;
    int nConfLimit;
    int nInsLimit;
    abctime clk;
    // set defaults
    fVerbose   = 0;
    nConfLimit = 0;
    nInsLimit  = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "CIvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nConfLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nConfLimit < 0 )
                goto usage;
            break;
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            nInsLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nInsLimit < 0 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( Abc_NtkLatchNum(pNtk) > 0 )
    {
        Abc_Print( -1, "Currently can only solve the miter for combinational circuits.\n" );
        return 0;
    }

    clk = Abc_Clock();
    if ( Abc_NtkIsStrash(pNtk) )
    {
        RetValue = Abc_NtkMiterSat( pNtk, (ABC_INT64_T)nConfLimit, (ABC_INT64_T)nInsLimit, fVerbose, NULL, NULL );
    }
    else
    {
        assert( Abc_NtkIsLogic(pNtk) );
        Abc_NtkToBdd( pNtk );
        RetValue = Abc_NtkMiterSat( pNtk, (ABC_INT64_T)nConfLimit, (ABC_INT64_T)nInsLimit, fVerbose, NULL, NULL );
    }

    // verify that the pattern is correct
    if ( RetValue == 0 && Abc_NtkPoNum(pNtk) == 1 )
    {
        //int i;
        //Abc_Obj_t * pObj;
        int * pSimInfo = Abc_NtkVerifySimulatePattern( pNtk, pNtk->pModel );
        if ( pSimInfo[0] != 1 )
            Abc_Print( 1, "ERROR in Abc_NtkMiterSat(): Generated counter example is invalid.\n" );
        ABC_FREE( pSimInfo );
        /*
        // print model
        Abc_NtkForEachPi( pNtk, pObj, i )
        {
            Abc_Print( -1, "%d", (int)(pNtk->pModel[i] > 0) );
            if ( i == 70 )
                break;
        }
        Abc_Print( -1, "\n" );
        */
    }
    pAbc->Status = RetValue;
    if ( RetValue == -1 )
        Abc_Print( 1, "UNDECIDED      " );
    else if ( RetValue == 0 )
        Abc_Print( 1, "SATISFIABLE    " );
    else
        Abc_Print( 1, "UNSATISFIABLE  " );
    //Abc_Print( -1, "\n" );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return 0;

usage:
    Abc_Print( -2, "usage: sat [-C num] [-I num] [-vh]\n" );
    Abc_Print( -2, "\t         solves the combinational miter using SAT solver MiniSat-1.14\n" );
    Abc_Print( -2, "\t         derives CNF from the current network and leave it unchanged\n" );
    Abc_Print( -2, "\t         (there is also a newer SAT solving command \"dsat\")\n" );
    Abc_Print( -2, "\t-C num : limit on the number of conflicts [default = %d]\n",    nConfLimit );
    Abc_Print( -2, "\t-I num : limit on the number of inspections [default = %d]\n", nInsLimit );
    Abc_Print( -2, "\t-v     : prints verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}